

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addRigidBody(Molecule *this,RigidBody *rb)

{
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  _Var1;
  RigidBody *local_10;
  
  local_10 = rb;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::RigidBody**,std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::RigidBody*const>>
                    ((this->rigidBodies_).
                     super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->rigidBodies_).
                     super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::push_back
              (&this->rigidBodies_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addRigidBody(RigidBody* rb) {
    if (std::find(rigidBodies_.begin(), rigidBodies_.end(), rb) ==
        rigidBodies_.end()) {
      rigidBodies_.push_back(rb);
    }
  }